

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void __thiscall rw::Matrix::optimize(Matrix *this,Tolerance *tolerance)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  Tolerance *pTVar11;
  float32 fVar12;
  float32 fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  pTVar11 = (Tolerance *)&matrixDefaultTolerance;
  if (tolerance != (Tolerance *)0x0) {
    pTVar11 = tolerance;
  }
  fVar12 = normalError(this);
  fVar1 = (float)pTVar11->normal;
  fVar2 = (float)pTVar11->orthogonal;
  fVar15 = (float)(this->at).x;
  fVar16 = (float)(this->up).x;
  fVar3 = (float)(this->at).y;
  fVar4 = (float)(this->up).y;
  fVar5 = (float)(this->at).z;
  fVar6 = (float)(this->up).z;
  fVar14 = fVar5 * fVar6 + fVar15 * fVar16 + fVar3 * fVar4;
  fVar7 = (float)(this->right).x;
  fVar8 = (float)(this->right).y;
  fVar9 = (float)(this->right).z;
  fVar15 = fVar5 * fVar9 + fVar15 * fVar7 + fVar3 * fVar8;
  fVar16 = fVar6 * fVar9 + fVar16 * fVar7 + fVar4 * fVar8;
  fVar15 = fVar16 * fVar16 + fVar14 * fVar14 + fVar15 * fVar15;
  uVar10 = 0;
  if (((float)fVar12 <= fVar1) && (uVar10 = 0, fVar15 <= fVar2)) {
    fVar13 = identityError(this);
    uVar10 = (uint)((float)fVar13 <= (float)pTVar11->identity) << 0x11;
  }
  this->flags = ((uint)((float)fVar12 <= fVar1) | this->flags & 0xfffdfffc) +
                (uint)(fVar15 <= fVar2) * 2 | uVar10;
  return;
}

Assistant:

void
Matrix::optimize(Tolerance *tolerance)
{
	bool32 isnormal, isorthogonal, isidentity;
	if(tolerance == nil)
		tolerance = &matrixDefaultTolerance;
	isnormal = normalError() <= tolerance->normal;
	isorthogonal = orthogonalError() <= tolerance->orthogonal;
	isidentity = isnormal && isorthogonal && identityError() <= tolerance->identity;
	if(isnormal)
		flags |= TYPENORMAL;
	else
		flags &= ~TYPENORMAL;
	if(isorthogonal)
		flags |= TYPEORTHOGONAL;
	else
		flags &= ~TYPEORTHOGONAL;
	if(isidentity)
		flags |= IDENTITY;
	else
		flags &= ~IDENTITY;
}